

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_hoa.cpp
# Opt level: O0

void __thiscall
ear::GainCalculatorHOAImpl::GainCalculatorHOAImpl(GainCalculatorHOAImpl *this,Layout *layout)

{
  anon_class_16_1_65cd491c *in_RCX;
  Matrix<double,__1,_3,_0,__1,_3> local_128;
  Matrix<double,__1,_3,_0,__1,_3> local_118;
  MatrixXd local_108;
  Matrix<double,__1,_3,_0,__1,_3> local_f0;
  vector<bool,_std::allocator<bool>_> local_e0;
  Array<bool,__1,_1,_0,__1,_1> local_b8;
  Layout local_a8;
  undefined1 local_38 [8];
  shared_ptr<ear::PointSourcePanner> panner;
  Layout *layout_local;
  GainCalculatorHOAImpl *this_local;
  
  Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::Matrix(&this->points);
  Eigen::Array<bool,_-1,_1,_0,_-1,_1>::Array(&this->is_lfe);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->G_virt);
  Layout::withoutLfe(&local_a8,layout);
  configurePolarPanner((ear *)local_38,&local_a8);
  Layout::~Layout(&local_a8);
  Layout::isLfe(&local_e0,layout);
  copy_vector<Eigen::Array<bool,__1,_1,_0,__1,_1>,_std::vector<bool,_std::allocator<bool>_>,_0>
            ((ear *)&local_b8,&local_e0);
  Eigen::Array<bool,_-1,_1,_0,_-1,_1>::operator=(&this->is_lfe,&local_b8);
  Eigen::Array<bool,_-1,_1,_0,_-1,_1>::~Array(&local_b8);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_e0);
  hoa::load_points();
  Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::operator=(&this->points,&local_f0);
  Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::~Matrix(&local_f0);
  Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::Matrix(&local_118,&this->points);
  std::shared_ptr<ear::PointSourcePanner>::shared_ptr
            ((shared_ptr<ear::PointSourcePanner> *)&local_128,
             (shared_ptr<ear::PointSourcePanner> *)local_38);
  hoa::calc_G_virt<ear::GainCalculatorHOAImpl::GainCalculatorHOAImpl(ear::Layout_const&)::__0>
            (&local_108,(hoa *)&local_118,&local_128,in_RCX);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->G_virt,&local_108);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_108);
  GainCalculatorHOAImpl(ear::Layout_const&)::$_0::~__0((__0 *)&local_128);
  Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::~Matrix(&local_118);
  std::shared_ptr<ear::PointSourcePanner>::~shared_ptr
            ((shared_ptr<ear::PointSourcePanner> *)local_38);
  return;
}

Assistant:

GainCalculatorHOAImpl::GainCalculatorHOAImpl(const Layout &layout) {
    std::shared_ptr<PointSourcePanner> panner =
        configurePolarPanner(layout.withoutLfe());
    is_lfe = copy_vector<decltype(is_lfe)>(layout.isLfe());
    points = hoa::load_points();
    G_virt = hoa::calc_G_virt(
        points, [panner](Eigen::Vector3d pos) { return panner->handle(pos); });
  }